

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void store_vertical_filter_output
               (__m128i *res_lo,__m128i *res_hi,__m128i *res_add_const,__m128i *wt,
               __m128i *res_sub_const,__m128i *round_bits_const,uint8_t *pred,
               ConvolveParams *conv_params,int i,int j,int k,int reduce_bits_vert,int p_stride,
               int p_width,int round_bits)

{
  undefined8 uVar1;
  char cVar2;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 *puVar21;
  undefined1 (*in_RCX) [16];
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  __m128i p_16_hi;
  __m128i p4_16;
  int in_stack_00000020;
  __m128i *dst8_4;
  __m128i res_hi_16;
  __m128i temp_hi_16;
  __m128i *p4;
  __m128i res_8_lo;
  __m128i shifted_32;
  __m128i wt_res_lo;
  __m128i p_16_lo;
  __m128i p_16;
  __m128i *dst8;
  __m128i res_lo_16;
  __m128i temp_lo_16;
  __m128i *p;
  __m128i res_hi_1;
  __m128i res_lo_1;
  undefined1 local_618 [16];
  undefined8 local_608;
  undefined1 local_588 [16];
  undefined8 local_578;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  int local_508;
  int iStack_504;
  int iStack_500;
  int iStack_4fc;
  int local_4e8;
  int iStack_4e4;
  int iStack_4e0;
  int iStack_4dc;
  int local_4c8;
  int iStack_4c4;
  int iStack_4c0;
  int iStack_4bc;
  int local_4b8;
  int iStack_4b4;
  int iStack_4b0;
  int iStack_4ac;
  int local_4a8;
  int iStack_4a4;
  int iStack_4a0;
  int iStack_49c;
  int local_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  short local_438;
  short sStack_436;
  short sStack_434;
  short sStack_432;
  short local_418;
  short sStack_416;
  short sStack_414;
  short sStack_412;
  short local_408;
  short sStack_406;
  short sStack_404;
  short sStack_402;
  short sStack_400;
  short sStack_3fe;
  short sStack_3fc;
  short sStack_3fa;
  short local_3e8;
  short sStack_3e6;
  short sStack_3e4;
  short sStack_3e2;
  short sStack_3e0;
  short sStack_3de;
  short sStack_3dc;
  short sStack_3da;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  short local_3c8;
  short sStack_3c6;
  short sStack_3c4;
  short sStack_3c2;
  undefined2 uStack_3c0;
  undefined2 uStack_3be;
  undefined2 uStack_3bc;
  undefined2 uStack_3ba;
  short local_3a8;
  short sStack_3a6;
  short sStack_3a4;
  short sStack_3a2;
  short sStack_3a0;
  short sStack_39e;
  short sStack_39c;
  short sStack_39a;
  short local_388;
  short sStack_386;
  short sStack_384;
  short sStack_382;
  short sStack_380;
  short sStack_37e;
  short sStack_37c;
  short sStack_37a;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short sStack_370;
  short sStack_36e;
  short sStack_36c;
  short sStack_36a;
  short local_368;
  short sStack_366;
  short sStack_364;
  short sStack_362;
  undefined2 uStack_360;
  undefined2 uStack_35e;
  undefined2 uStack_35c;
  undefined2 uStack_35a;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  __m128i *p_1;
  __m128i res_8bit;
  __m128i res_16bit;
  __m128i res_hi_round;
  __m128i res_lo_round;
  __m128i res_8_hi;
  __m128i shifted_32_1;
  __m128i wt_res_hi;
  char cVar3;
  char cVar4;
  char cVar5;
  
  local_498 = (int)*in_RDI;
  iStack_494 = (int)((ulong)*in_RDI >> 0x20);
  iStack_490 = (int)in_RDI[1];
  iStack_48c = (int)((ulong)in_RDI[1] >> 0x20);
  local_4b8 = (int)*in_RSI;
  iStack_4b4 = (int)((ulong)*in_RSI >> 0x20);
  iStack_4b0 = (int)in_RSI[1];
  iStack_4ac = (int)((ulong)in_RSI[1] >> 0x20);
  if (*(int *)(p4_16[0] + 0x20) == 0) {
    local_4e8 = (int)*in_RDX;
    iStack_4e4 = (int)((ulong)*in_RDX >> 0x20);
    iStack_4e0 = (int)in_RDX[1];
    iStack_4dc = (int)((ulong)in_RDX[1] >> 0x20);
    auVar22 = ZEXT416((uint)res_hi_16[0]);
    local_508 = (int)*in_RDX;
    iStack_504 = (int)((ulong)*in_RDX >> 0x20);
    iStack_500 = (int)in_RDX[1];
    iStack_4fc = (int)((ulong)in_RDX[1] >> 0x20);
    auVar23 = ZEXT416((uint)res_hi_16[0]);
    auVar20._4_4_ = iStack_494 + iStack_4e4 >> auVar22;
    auVar20._0_4_ = local_498 + local_4e8 >> auVar22;
    auVar20._12_4_ = iStack_48c + iStack_4dc >> auVar22;
    auVar20._8_4_ = iStack_490 + iStack_4e0 >> auVar22;
    auVar22._4_4_ = iStack_4b4 + iStack_504 >> auVar23;
    auVar22._0_4_ = local_4b8 + local_508 >> auVar23;
    auVar22._12_4_ = iStack_4ac + iStack_4fc >> auVar23;
    auVar22._8_4_ = iStack_4b0 + iStack_500 >> auVar23;
    auVar22 = packssdw(auVar20,auVar22);
    local_138 = auVar22._0_2_;
    sStack_136 = auVar22._2_2_;
    sStack_134 = auVar22._4_2_;
    sStack_132 = auVar22._6_2_;
    sStack_130 = auVar22._8_2_;
    sStack_12e = auVar22._10_2_;
    sStack_12c = auVar22._12_2_;
    sStack_12a = auVar22._14_2_;
    cVar2 = (0 < local_138) * (local_138 < 0x100) * auVar22[0] - (0xff < local_138);
    cVar3 = (0 < sStack_136) * (sStack_136 < 0x100) * auVar22[2] - (0xff < sStack_136);
    cVar4 = (0 < sStack_134) * (sStack_134 < 0x100) * auVar22[4] - (0xff < sStack_134);
    cVar5 = (0 < sStack_132) * (sStack_132 < 0x100) * auVar22[6] - (0xff < sStack_132);
    puVar21 = (undefined8 *)
              (p_16_hi[1] +
              (((int)p4_16[1] + (int)dst8_4 + 4) * (int)res_hi_16[1] + in_stack_00000020));
    if ((int)temp_hi_16[0] == 4) {
      *(uint *)puVar21 = CONCAT13(cVar5,CONCAT12(cVar4,CONCAT11(cVar3,cVar2)));
    }
    else {
      *puVar21 = CONCAT17((0 < sStack_12a) * (sStack_12a < 0x100) * auVar22[0xe] -
                          (0xff < sStack_12a),
                          CONCAT16((0 < sStack_12c) * (sStack_12c < 0x100) * auVar22[0xc] -
                                   (0xff < sStack_12c),
                                   CONCAT15((0 < sStack_12e) * (sStack_12e < 0x100) * auVar22[10] -
                                            (0xff < sStack_12e),
                                            CONCAT14((0 < sStack_130) * (sStack_130 < 0x100) *
                                                     auVar22[8] - (0xff < sStack_130),
                                                     CONCAT13(cVar5,CONCAT12(cVar4,CONCAT11(cVar3,
                                                  cVar2)))))));
    }
  }
  else {
    puVar21 = (undefined8 *)
              (*(long *)(p4_16[0] + 8) +
              (long)(((int)p4_16[1] + (int)dst8_4 + 4) * *(int *)(p4_16[0] + 0x10) +
                    in_stack_00000020) * 2);
    local_4a8 = (int)*in_RDX;
    iStack_4a4 = (int)((ulong)*in_RDX >> 0x20);
    iStack_4a0 = (int)in_RDX[1];
    iStack_49c = (int)((ulong)in_RDX[1] >> 0x20);
    auVar22 = ZEXT416((uint)res_hi_16[0]);
    local_548 = CONCAT44(iStack_494 + iStack_4a4 >> auVar22,local_498 + local_4a8 >> auVar22);
    uStack_540 = CONCAT44(iStack_48c + iStack_49c >> auVar22,iStack_490 + iStack_4a0 >> auVar22);
    auVar15._8_8_ = uStack_540;
    auVar15._0_8_ = local_548;
    auVar23._8_8_ = uStack_540;
    auVar23._0_8_ = local_548;
    auVar22 = packusdw(auVar15,auVar23);
    local_578 = auVar22._0_8_;
    if (*(int *)p4_16[0] == 0) {
      *puVar21 = local_578;
    }
    else {
      uVar1 = *puVar21;
      local_418 = (short)uVar1;
      sStack_416 = (short)((ulong)uVar1 >> 0x10);
      sStack_414 = (short)((ulong)uVar1 >> 0x20);
      sStack_412 = (short)((ulong)uVar1 >> 0x30);
      local_368 = auVar22._0_2_;
      sStack_366 = auVar22._2_2_;
      sStack_364 = auVar22._4_2_;
      sStack_362 = auVar22._6_2_;
      if (*(int *)(p4_16[0] + 0x24) == 0) {
        uStack_360 = auVar22._8_2_;
        uStack_35e = auVar22._10_2_;
        uStack_35c = auVar22._12_2_;
        uStack_35a = auVar22._14_2_;
        auVar19._2_2_ = sStack_416 + sStack_366;
        auVar19._0_2_ = local_418 + local_368;
        auVar19._4_2_ = sStack_414 + sStack_364;
        auVar19._6_2_ = sStack_412 + sStack_362;
        auVar19._8_2_ = uStack_360;
        auVar19._10_2_ = uStack_35e;
        auVar19._12_2_ = uStack_35c;
        auVar19._14_2_ = uStack_35a;
        local_588 = psraw(auVar19,ZEXT416(1));
      }
      else {
        auVar8._2_2_ = local_368;
        auVar8._0_2_ = local_418;
        auVar8._4_2_ = sStack_416;
        auVar8._6_2_ = sStack_366;
        auVar8._10_2_ = sStack_364;
        auVar8._8_2_ = sStack_414;
        auVar8._12_2_ = sStack_412;
        auVar8._14_2_ = sStack_362;
        auVar22 = pmaddwd(auVar8,*in_RCX);
        local_278 = auVar22._0_4_;
        iStack_274 = auVar22._4_4_;
        iStack_270 = auVar22._8_4_;
        iStack_26c = auVar22._12_4_;
        auVar22 = ZEXT416(4);
        auVar14._4_4_ = iStack_274 >> auVar22;
        auVar14._0_4_ = local_278 >> auVar22;
        auVar14._12_4_ = iStack_26c >> auVar22;
        auVar14._8_4_ = iStack_270 >> auVar22;
        auVar13._4_4_ = iStack_274 >> auVar22;
        auVar13._0_4_ = local_278 >> auVar22;
        auVar13._12_4_ = iStack_26c >> auVar22;
        auVar13._8_4_ = iStack_270 >> auVar22;
        local_588 = packusdw(auVar14,auVar13);
      }
      uVar1 = *in_R8;
      uVar6 = in_R8[1];
      local_378 = local_588._0_2_;
      sStack_376 = local_588._2_2_;
      sStack_374 = local_588._4_2_;
      sStack_372 = local_588._6_2_;
      sStack_370 = local_588._8_2_;
      sStack_36e = local_588._10_2_;
      sStack_36c = local_588._12_2_;
      sStack_36a = local_588._14_2_;
      local_388 = (short)uVar1;
      sStack_386 = (short)((ulong)uVar1 >> 0x10);
      sStack_384 = (short)((ulong)uVar1 >> 0x20);
      sStack_382 = (short)((ulong)uVar1 >> 0x30);
      sStack_380 = (short)uVar6;
      sStack_37e = (short)((ulong)uVar6 >> 0x10);
      sStack_37c = (short)((ulong)uVar6 >> 0x20);
      sStack_37a = (short)((ulong)uVar6 >> 0x30);
      uVar1 = *in_R9;
      uVar6 = in_R9[1];
      local_3a8 = (short)uVar1;
      sStack_3a6 = (short)((ulong)uVar1 >> 0x10);
      sStack_3a4 = (short)((ulong)uVar1 >> 0x20);
      sStack_3a2 = (short)((ulong)uVar1 >> 0x30);
      sStack_3a0 = (short)uVar6;
      sStack_39e = (short)((ulong)uVar6 >> 0x10);
      sStack_39c = (short)((ulong)uVar6 >> 0x20);
      sStack_39a = (short)((ulong)uVar6 >> 0x30);
      auVar18._2_2_ = sStack_376 + sStack_386 + sStack_3a6;
      auVar18._0_2_ = local_378 + local_388 + local_3a8;
      auVar18._4_2_ = sStack_374 + sStack_384 + sStack_3a4;
      auVar18._6_2_ = sStack_372 + sStack_382 + sStack_3a2;
      auVar18._8_2_ = sStack_370 + sStack_380 + sStack_3a0;
      auVar18._10_2_ = sStack_36e + sStack_37e + sStack_39e;
      auVar18._12_2_ = sStack_36c + sStack_37c + sStack_39c;
      auVar18._14_2_ = sStack_36a + sStack_37a + sStack_39a;
      auVar22 = psraw(auVar18,ZEXT416((uint)temp_hi_16[1]));
      local_f8 = auVar22._0_2_;
      sStack_f6 = auVar22._2_2_;
      sStack_f4 = auVar22._4_2_;
      sStack_f2 = auVar22._6_2_;
      *(uint *)(p_16_hi[1] +
               (((int)p4_16[1] + 4 + (int)dst8_4) * (int)res_hi_16[1] + in_stack_00000020)) =
           CONCAT13((0 < sStack_f2) * (sStack_f2 < 0x100) * auVar22[6] - (0xff < sStack_f2),
                    CONCAT12((0 < sStack_f4) * (sStack_f4 < 0x100) * auVar22[4] - (0xff < sStack_f4)
                             ,CONCAT11((0 < sStack_f6) * (sStack_f6 < 0x100) * auVar22[2] -
                                       (0xff < sStack_f6),
                                       (0 < local_f8) * (local_f8 < 0x100) * auVar22[0] -
                                       (0xff < local_f8))));
    }
    if (4 < (int)temp_hi_16[0]) {
      puVar21 = (undefined8 *)
                (*(long *)(p4_16[0] + 8) +
                (long)(((int)p4_16[1] + (int)dst8_4 + 4) * *(int *)(p4_16[0] + 0x10) +
                       in_stack_00000020 + 4) * 2);
      local_4c8 = (int)*in_RDX;
      iStack_4c4 = (int)((ulong)*in_RDX >> 0x20);
      iStack_4c0 = (int)in_RDX[1];
      iStack_4bc = (int)((ulong)in_RDX[1] >> 0x20);
      auVar22 = ZEXT416((uint)res_hi_16[0]);
      local_558 = CONCAT44(iStack_4b4 + iStack_4c4 >> auVar22,local_4b8 + local_4c8 >> auVar22);
      uStack_550 = CONCAT44(iStack_4ac + iStack_4bc >> auVar22,iStack_4b0 + iStack_4c0 >> auVar22);
      auVar12._8_8_ = uStack_550;
      auVar12._0_8_ = local_558;
      auVar11._8_8_ = uStack_550;
      auVar11._0_8_ = local_558;
      auVar22 = packusdw(auVar12,auVar11);
      local_608 = auVar22._0_8_;
      if (*(int *)p4_16[0] == 0) {
        *puVar21 = local_608;
      }
      else {
        uVar1 = *puVar21;
        local_438 = (short)uVar1;
        sStack_436 = (short)((ulong)uVar1 >> 0x10);
        sStack_434 = (short)((ulong)uVar1 >> 0x20);
        sStack_432 = (short)((ulong)uVar1 >> 0x30);
        local_3c8 = auVar22._0_2_;
        sStack_3c6 = auVar22._2_2_;
        sStack_3c4 = auVar22._4_2_;
        sStack_3c2 = auVar22._6_2_;
        if (*(int *)(p4_16[0] + 0x24) == 0) {
          uStack_3c0 = auVar22._8_2_;
          uStack_3be = auVar22._10_2_;
          uStack_3bc = auVar22._12_2_;
          uStack_3ba = auVar22._14_2_;
          auVar17._2_2_ = sStack_436 + sStack_3c6;
          auVar17._0_2_ = local_438 + local_3c8;
          auVar17._4_2_ = sStack_434 + sStack_3c4;
          auVar17._6_2_ = sStack_432 + sStack_3c2;
          auVar17._8_2_ = uStack_3c0;
          auVar17._10_2_ = uStack_3be;
          auVar17._12_2_ = uStack_3bc;
          auVar17._14_2_ = uStack_3ba;
          local_618 = psraw(auVar17,ZEXT416(1));
        }
        else {
          auVar7._2_2_ = local_3c8;
          auVar7._0_2_ = local_438;
          auVar7._4_2_ = sStack_436;
          auVar7._6_2_ = sStack_3c6;
          auVar7._10_2_ = sStack_3c4;
          auVar7._8_2_ = sStack_434;
          auVar7._12_2_ = sStack_432;
          auVar7._14_2_ = sStack_3c2;
          auVar22 = pmaddwd(auVar7,*in_RCX);
          local_2b8 = auVar22._0_4_;
          iStack_2b4 = auVar22._4_4_;
          iStack_2b0 = auVar22._8_4_;
          iStack_2ac = auVar22._12_4_;
          auVar22 = ZEXT416(4);
          auVar10._4_4_ = iStack_2b4 >> auVar22;
          auVar10._0_4_ = local_2b8 >> auVar22;
          auVar10._12_4_ = iStack_2ac >> auVar22;
          auVar10._8_4_ = iStack_2b0 >> auVar22;
          auVar9._4_4_ = iStack_2b4 >> auVar22;
          auVar9._0_4_ = local_2b8 >> auVar22;
          auVar9._12_4_ = iStack_2ac >> auVar22;
          auVar9._8_4_ = iStack_2b0 >> auVar22;
          local_618 = packusdw(auVar10,auVar9);
        }
        uVar1 = *in_R8;
        uVar6 = in_R8[1];
        local_3d8 = local_618._0_2_;
        sStack_3d6 = local_618._2_2_;
        sStack_3d4 = local_618._4_2_;
        sStack_3d2 = local_618._6_2_;
        sStack_3d0 = local_618._8_2_;
        sStack_3ce = local_618._10_2_;
        sStack_3cc = local_618._12_2_;
        sStack_3ca = local_618._14_2_;
        local_3e8 = (short)uVar1;
        sStack_3e6 = (short)((ulong)uVar1 >> 0x10);
        sStack_3e4 = (short)((ulong)uVar1 >> 0x20);
        sStack_3e2 = (short)((ulong)uVar1 >> 0x30);
        sStack_3e0 = (short)uVar6;
        sStack_3de = (short)((ulong)uVar6 >> 0x10);
        sStack_3dc = (short)((ulong)uVar6 >> 0x20);
        sStack_3da = (short)((ulong)uVar6 >> 0x30);
        uVar1 = *in_R9;
        uVar6 = in_R9[1];
        local_408 = (short)uVar1;
        sStack_406 = (short)((ulong)uVar1 >> 0x10);
        sStack_404 = (short)((ulong)uVar1 >> 0x20);
        sStack_402 = (short)((ulong)uVar1 >> 0x30);
        sStack_400 = (short)uVar6;
        sStack_3fe = (short)((ulong)uVar6 >> 0x10);
        sStack_3fc = (short)((ulong)uVar6 >> 0x20);
        sStack_3fa = (short)((ulong)uVar6 >> 0x30);
        auVar16._2_2_ = sStack_3d6 + sStack_3e6 + sStack_406;
        auVar16._0_2_ = local_3d8 + local_3e8 + local_408;
        auVar16._4_2_ = sStack_3d4 + sStack_3e4 + sStack_404;
        auVar16._6_2_ = sStack_3d2 + sStack_3e2 + sStack_402;
        auVar16._8_2_ = sStack_3d0 + sStack_3e0 + sStack_400;
        auVar16._10_2_ = sStack_3ce + sStack_3de + sStack_3fe;
        auVar16._12_2_ = sStack_3cc + sStack_3dc + sStack_3fc;
        auVar16._14_2_ = sStack_3ca + sStack_3da + sStack_3fa;
        auVar22 = psraw(auVar16,ZEXT416((uint)temp_hi_16[1]));
        local_118 = auVar22._0_2_;
        sStack_116 = auVar22._2_2_;
        sStack_114 = auVar22._4_2_;
        sStack_112 = auVar22._6_2_;
        *(uint *)((long)(((int)p4_16[1] + 4 + (int)dst8_4) * (int)res_hi_16[1] + in_stack_00000020)
                  + 4 + p_16_hi[1]) =
             CONCAT13((0 < sStack_112) * (sStack_112 < 0x100) * auVar22[6] - (0xff < sStack_112),
                      CONCAT12((0 < sStack_114) * (sStack_114 < 0x100) * auVar22[4] -
                               (0xff < sStack_114),
                               CONCAT11((0 < sStack_116) * (sStack_116 < 0x100) * auVar22[2] -
                                        (0xff < sStack_116),
                                        (0 < local_118) * (local_118 < 0x100) * auVar22[0] -
                                        (0xff < local_118))));
      }
    }
  }
  return;
}

Assistant:

static inline void store_vertical_filter_output(
    __m128i *res_lo, __m128i *res_hi, const __m128i *res_add_const,
    const __m128i *wt, const __m128i *res_sub_const, __m128i *round_bits_const,
    uint8_t *pred, ConvolveParams *conv_params, int i, int j, int k,
    const int reduce_bits_vert, int p_stride, int p_width,
    const int round_bits) {
  __m128i res_lo_1 = *res_lo;
  __m128i res_hi_1 = *res_hi;

  if (conv_params->is_compound) {
    __m128i *const p =
        (__m128i *)&conv_params->dst[(i + k + 4) * conv_params->dst_stride + j];
    res_lo_1 = _mm_srai_epi32(_mm_add_epi32(res_lo_1, *res_add_const),
                              reduce_bits_vert);
    const __m128i temp_lo_16 = _mm_packus_epi32(res_lo_1, res_lo_1);
    __m128i res_lo_16;
    if (conv_params->do_average) {
      __m128i *const dst8 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
      const __m128i p_16 = _mm_loadl_epi64(p);

      if (conv_params->use_dist_wtd_comp_avg) {
        const __m128i p_16_lo = _mm_unpacklo_epi16(p_16, temp_lo_16);
        const __m128i wt_res_lo = _mm_madd_epi16(p_16_lo, *wt);
        const __m128i shifted_32 =
            _mm_srai_epi32(wt_res_lo, DIST_PRECISION_BITS);
        res_lo_16 = _mm_packus_epi32(shifted_32, shifted_32);
      } else {
        res_lo_16 = _mm_srai_epi16(_mm_add_epi16(p_16, temp_lo_16), 1);
      }

      res_lo_16 = _mm_add_epi16(res_lo_16, *res_sub_const);

      res_lo_16 = _mm_srai_epi16(_mm_add_epi16(res_lo_16, *round_bits_const),
                                 round_bits);
      __m128i res_8_lo = _mm_packus_epi16(res_lo_16, res_lo_16);
      *(int *)dst8 = _mm_cvtsi128_si32(res_8_lo);
    } else {
      _mm_storel_epi64(p, temp_lo_16);
    }
    if (p_width > 4) {
      __m128i *const p4 =
          (__m128i *)&conv_params
              ->dst[(i + k + 4) * conv_params->dst_stride + j + 4];
      res_hi_1 = _mm_srai_epi32(_mm_add_epi32(res_hi_1, *res_add_const),
                                reduce_bits_vert);
      const __m128i temp_hi_16 = _mm_packus_epi32(res_hi_1, res_hi_1);
      __m128i res_hi_16;

      if (conv_params->do_average) {
        __m128i *const dst8_4 =
            (__m128i *)&pred[(i + k + 4) * p_stride + j + 4];
        const __m128i p4_16 = _mm_loadl_epi64(p4);

        if (conv_params->use_dist_wtd_comp_avg) {
          const __m128i p_16_hi = _mm_unpacklo_epi16(p4_16, temp_hi_16);
          const __m128i wt_res_hi = _mm_madd_epi16(p_16_hi, *wt);
          const __m128i shifted_32 =
              _mm_srai_epi32(wt_res_hi, DIST_PRECISION_BITS);
          res_hi_16 = _mm_packus_epi32(shifted_32, shifted_32);
        } else {
          res_hi_16 = _mm_srai_epi16(_mm_add_epi16(p4_16, temp_hi_16), 1);
        }
        res_hi_16 = _mm_add_epi16(res_hi_16, *res_sub_const);

        res_hi_16 = _mm_srai_epi16(_mm_add_epi16(res_hi_16, *round_bits_const),
                                   round_bits);
        __m128i res_8_hi = _mm_packus_epi16(res_hi_16, res_hi_16);
        *(int *)dst8_4 = _mm_cvtsi128_si32(res_8_hi);

      } else {
        _mm_storel_epi64(p4, temp_hi_16);
      }
    }
  } else {
    const __m128i res_lo_round = _mm_srai_epi32(
        _mm_add_epi32(res_lo_1, *res_add_const), reduce_bits_vert);
    const __m128i res_hi_round = _mm_srai_epi32(
        _mm_add_epi32(res_hi_1, *res_add_const), reduce_bits_vert);

    const __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
    __m128i res_8bit = _mm_packus_epi16(res_16bit, res_16bit);

    // Store, blending with 'pred' if needed
    __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];

    // Note: If we're outputting a 4x4 block, we need to be very careful
    // to only output 4 pixels at this point, to avoid encode/decode
    // mismatches when encoding with multiple threads.
    if (p_width == 4) {
      *(int *)p = _mm_cvtsi128_si32(res_8bit);
    } else {
      _mm_storel_epi64(p, res_8bit);
    }
  }
}